

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O0

int kputw(int c,kstring_t *s)

{
  undefined1 uVar1;
  long lVar2;
  void *pvVar3;
  uint uVar4;
  char *tmp;
  uint local_30;
  uint x;
  int l;
  int i;
  char buf [16];
  kstring_t *s_local;
  int c_local;
  
  buf._8_8_ = s;
  local_30 = 0;
  tmp._4_4_ = c;
  uVar4 = local_30;
  if (c < 0) {
    tmp._4_4_ = -c;
  }
  do {
    local_30 = uVar4;
    uVar4 = local_30 + 1;
    *(char *)((long)&l + (long)(int)local_30) = (char)((ulong)tmp._4_4_ % 10) + '0';
    tmp._4_4_ = tmp._4_4_ / 10;
  } while (tmp._4_4_ != 0);
  if (c < 0) {
    *(undefined1 *)((long)&l + (long)(int)uVar4) = 0x2d;
    uVar4 = local_30 + 2;
  }
  local_30 = uVar4;
  x = local_30;
  if (*(ulong *)(buf._8_8_ + 8) <= *(long *)buf._8_8_ + (long)(int)local_30 + 1U) {
    *(long *)(buf._8_8_ + 8) = *(long *)buf._8_8_ + (long)(int)local_30 + 2;
    *(long *)(buf._8_8_ + 8) = *(long *)(buf._8_8_ + 8) + -1;
    *(ulong *)(buf._8_8_ + 8) = *(ulong *)(buf._8_8_ + 8) >> 1 | *(ulong *)(buf._8_8_ + 8);
    *(ulong *)(buf._8_8_ + 8) = *(ulong *)(buf._8_8_ + 8) >> 2 | *(ulong *)(buf._8_8_ + 8);
    *(ulong *)(buf._8_8_ + 8) = *(ulong *)(buf._8_8_ + 8) >> 4 | *(ulong *)(buf._8_8_ + 8);
    *(ulong *)(buf._8_8_ + 8) = *(ulong *)(buf._8_8_ + 8) >> 8 | *(ulong *)(buf._8_8_ + 8);
    *(ulong *)(buf._8_8_ + 8) = *(ulong *)(buf._8_8_ + 8) >> 0x10 | *(ulong *)(buf._8_8_ + 8);
    *(long *)(buf._8_8_ + 8) = *(long *)(buf._8_8_ + 8) + 1;
    pvVar3 = realloc(*(void **)(buf._8_8_ + 0x10),*(size_t *)(buf._8_8_ + 8));
    if (pvVar3 == (void *)0x0) {
      return -1;
    }
    *(void **)(buf._8_8_ + 0x10) = pvVar3;
  }
  while (x = x - 1, -1 < (int)x) {
    uVar1 = *(undefined1 *)((long)&l + (long)(int)x);
    lVar2 = *(long *)buf._8_8_;
    *(long *)buf._8_8_ = lVar2 + 1;
    *(undefined1 *)(*(long *)(buf._8_8_ + 0x10) + lVar2) = uVar1;
  }
  *(undefined1 *)(*(long *)(buf._8_8_ + 0x10) + *(long *)buf._8_8_) = 0;
  return 0;
}

Assistant:

static inline int kputw(int c, kstring_t *s)
{
	char buf[16];
	int i, l = 0;
	unsigned int x = c;
	if (c < 0) x = -x;
	do { buf[l++] = x%10 + '0'; x /= 10; } while (x > 0);
	if (c < 0) buf[l++] = '-';
	if (s->l + l + 1 >= s->m) {
		char *tmp;
		s->m = s->l + l + 2;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	for (i = l - 1; i >= 0; --i) s->s[s->l++] = buf[i];
	s->s[s->l] = 0;
	return 0;
}